

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_estimator.c
# Opt level: O0

void PCorr(double *in,double *outcorr)

{
  double *pdVar1;
  double dVar2;
  int local_48;
  int local_44;
  int n;
  int k;
  double *inptr;
  double *x;
  double prod;
  double ysum;
  double sum;
  double *outcorr_local;
  double *in_local;
  
  prod = 1e-13;
  ysum = 0.0;
  pdVar1 = in + 0x48;
  for (local_48 = 0; local_48 < 0x3c; local_48 = local_48 + 1) {
    prod = in[local_48] * in[local_48] + prod;
    ysum = pdVar1[local_48] * in[local_48] + ysum;
  }
  sum = (double)(outcorr + 0x40);
  dVar2 = sqrt(prod);
  *(double *)sum = ysum / dVar2;
  for (local_44 = 1; local_44 < 0x41; local_44 = local_44 + 1) {
    prod = in[local_44 + 0x3b] * in[local_44 + 0x3b] + -in[local_44 + -1] * in[local_44 + -1] + prod
    ;
    ysum = 0.0;
    x = (double *)(*pdVar1 * in[local_44]);
    for (local_48 = 1; local_48 < 0x3c; local_48 = local_48 + 1) {
      ysum = (double)x + ysum;
      x = (double *)(pdVar1[local_48] * (in + local_44)[local_48]);
    }
    sum = (double)((long)sum + -8);
    dVar2 = sqrt(prod);
    *(double *)sum = ((double)x + ysum) / dVar2;
  }
  return;
}

Assistant:

static void PCorr(const double *in, double *outcorr)
{
  double sum, ysum, prod;
  const double *x, *inptr;
  int k, n;

  //ysum = 1e-6;          /* use this with float (i.s.o. double)! */
  ysum = 1e-13;
  sum = 0.0;
  x = in + PITCH_MAX_LAG/2 + 2;
  for (n = 0; n < PITCH_CORR_LEN2; n++) {
    ysum += in[n] * in[n];
    sum += x[n] * in[n];
  }

  outcorr += PITCH_LAG_SPAN2 - 1;     /* index of last element in array */
  *outcorr = sum / sqrt(ysum);

  for (k = 1; k < PITCH_LAG_SPAN2; k++) {
    ysum -= in[k-1] * in[k-1];
    ysum += in[PITCH_CORR_LEN2 + k - 1] * in[PITCH_CORR_LEN2 + k - 1];
    sum = 0.0;
    inptr = &in[k];
    prod = x[0] * inptr[0];
    for (n = 1; n < PITCH_CORR_LEN2; n++) {
      sum += prod;
      prod = x[n] * inptr[n];
    }
    sum += prod;
    outcorr--;
    *outcorr = sum / sqrt(ysum);
  }
}